

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaAllocator_T::FlushOrInvalidateAllocation
          (VmaAllocator_T *this,VmaAllocation hAllocation,VkDeviceSize offset,VkDeviceSize size,
          VMA_CACHE_OPERATION op)

{
  bool bVar1;
  VmaVulkanFunctions *pVVar2;
  VkMappedMemoryRange *in_RDX;
  VkDeviceSize in_RSI;
  VmaAllocator_T *in_RDI;
  int in_R8D;
  VmaAllocation unaff_retaddr;
  VmaAllocator_T *in_stack_00000008;
  VkMappedMemoryRange memRange;
  VkResult res;
  VkMappedMemoryRange local_50;
  VkResult local_28;
  int local_24;
  VmaAllocator_T *offset_00;
  
  local_28 = VK_SUCCESS;
  local_24 = in_R8D;
  offset_00 = in_RDI;
  memset(&local_50,0,0x28);
  bVar1 = GetFlushOrInvalidateRange
                    (in_stack_00000008,unaff_retaddr,(VkDeviceSize)offset_00,in_RSI,in_RDX);
  if (bVar1) {
    if (local_24 == 0) {
      pVVar2 = GetVulkanFunctions(in_RDI);
      local_28 = (*pVVar2->vkFlushMappedMemoryRanges)(in_RDI->m_hDevice,1,&local_50);
    }
    else if (local_24 == 1) {
      pVVar2 = GetVulkanFunctions(in_RDI);
      local_28 = (*pVVar2->vkInvalidateMappedMemoryRanges)(in_RDI->m_hDevice,1,&local_50);
    }
  }
  return local_28;
}

Assistant:

VkResult VmaAllocator_T::FlushOrInvalidateAllocation(
    VmaAllocation hAllocation,
    VkDeviceSize offset, VkDeviceSize size,
    VMA_CACHE_OPERATION op)
{
    VkResult res = VK_SUCCESS;

    VkMappedMemoryRange memRange = {};
    if(GetFlushOrInvalidateRange(hAllocation, offset, size, memRange))
    {
        switch(op)
        {
        case VMA_CACHE_FLUSH:
            res = (*GetVulkanFunctions().vkFlushMappedMemoryRanges)(m_hDevice, 1, &memRange);
            break;
        case VMA_CACHE_INVALIDATE:
            res = (*GetVulkanFunctions().vkInvalidateMappedMemoryRanges)(m_hDevice, 1, &memRange);
            break;
        default:
            VMA_ASSERT(0);
        }
    }
    // else: Just ignore this call.
    return res;
}